

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmissionSystem.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::EmissionSystem::~EmissionSystem(EmissionSystem *this)

{
  EmissionSystem *this_local;
  
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EmissionSystem_0032d798;
  std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>::clear
            (&this->m_vEmitterBeams);
  std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>::~vector
            (&this->m_vEmitterBeams);
  Vector::~Vector(&this->m_Location);
  EmitterSystem::~EmitterSystem(&this->m_EmitterSystemRecord);
  DataTypeBase::~DataTypeBase(&this->super_DataTypeBase);
  return;
}

Assistant:

EmissionSystem::~EmissionSystem()
{
    m_vEmitterBeams.clear();
}